

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

void on_connect(uv_connect_t *req,int status)

{
  int64_t eval_b;
  int64_t eval_a;
  int status_local;
  uv_connect_t *req_local;
  
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,99,"status","==","0",(long)status,"==",0);
    abort();
  }
  do_write((uv_stream_t *)&client,on_write_close_immediately);
  return;
}

Assistant:

static void on_connect(uv_connect_t* req, int status) {
  struct sockaddr sockname, peername;
  int r, namelen;

  ASSERT_OK(status);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname((uv_tcp_t*) req->handle, &sockname, &namelen);
  ASSERT_OK(r);
  check_sockname(&sockname, "127.0.0.1", 0, "connected socket");
  getsocknamecount_tcp++;

  namelen = sizeof peername;
  r = uv_tcp_getpeername((uv_tcp_t*) req->handle, &peername, &namelen);
  ASSERT_OK(r);
  check_sockname(&peername, "127.0.0.1", server_port, "connected socket peer");
  getpeernamecount++;

  uv_close((uv_handle_t*)&tcp, NULL);
}